

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::subViewsTest<true>(ViewTest *this)

{
  bool bVar1;
  size_t sVar2;
  reference piVar3;
  long lVar4;
  int *data;
  int y_2;
  int iVar5;
  int y_1;
  int y;
  int iVar6;
  int iVar7;
  allocator_type local_f1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base;
  View<int,_true,_std::allocator<unsigned_long>_> s;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  data = this->data_;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,1,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 4;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 1) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 1);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0);
  local_f1 = (allocator_type)(*piVar3 == 4);
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,1,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 4;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 1) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 1);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0);
  local_f1 = (allocator_type)(*piVar3 == 4);
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,1,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 4;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 3) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 1);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0);
  if (*piVar3 == 4) {
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,1);
    if (*piVar3 != 5) goto LAB_00176d55;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,2);
    local_f1 = (allocator_type)(*piVar3 == 6);
  }
  else {
LAB_00176d55:
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,1,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 4;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 3) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 1);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0);
  if (*piVar3 == 4) {
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,1);
    if (*piVar3 != 5) goto LAB_00176e98;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,2);
    local_f1 = (allocator_type)(*piVar3 == 6);
  }
  else {
LAB_00176e98:
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,2,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 1) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 2);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0);
  local_f1 = (allocator_type)(*piVar3 == 0xe);
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,2,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 1) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 2);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0);
  local_f1 = (allocator_type)(*piVar3 == 10);
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,2,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 4) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 2);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0);
  if (*piVar3 == 0) {
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,1);
    if (*piVar3 != 6) goto LAB_0017722e;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,2);
    if (*piVar3 != 0xc) goto LAB_0017722e;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,3);
    local_f1 = (allocator_type)(*piVar3 == 0x12);
  }
  else {
LAB_0017722e:
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,2,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 4) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 2);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0);
  if (*piVar3 == 0) {
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,1);
    if (*piVar3 != 1) goto LAB_00177396;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,2);
    if (*piVar3 != 2) goto LAB_00177396;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,3);
    local_f1 = (allocator_type)(*piVar3 == 3);
  }
  else {
LAB_00177396:
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,2,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 6) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 2);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  lVar4 = 0;
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
      piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&s,sVar2,iVar6);
      local_f1 = (allocator_type)(*piVar3 == (&DAT_001cb440)[sVar2 + (long)(int)lVar4]);
      test((bool *)&local_f1);
    }
    lVar4 = (long)(int)lVar4 + 3;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,2,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 6) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 2);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  lVar4 = 0;
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (sVar2 = 0; sVar2 != 3; sVar2 = sVar2 + 1) {
      piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&s,sVar2,iVar6);
      local_f1 = (allocator_type)(*piVar3 == (&DAT_001cb460)[sVar2 + (long)(int)lVar4]);
      test((bool *)&local_f1);
    }
    lVar4 = (long)(int)lVar4 + 3;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 1) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0,0);
  local_f1 = (allocator_type)(*piVar3 == 4);
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 1) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0,0);
  local_f1 = (allocator_type)(*piVar3 == 10);
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 3) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0,0);
  if (*piVar3 == 4) {
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,1,0);
    if (*piVar3 != 7) goto LAB_00177a4b;
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,2,0);
    local_f1 = (allocator_type)(*piVar3 == 10);
  }
  else {
LAB_00177a4b:
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 3) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                     ((View<int,true,std::allocator<unsigned_long>> *)&s,0,0,0);
  if (*piVar3 == 10) {
    piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                       ((View<int,true,std::allocator<unsigned_long>> *)&s,0,1,0);
    if (*piVar3 == 0xc) {
      piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&s,0,2,0);
      local_f1 = (allocator_type)(*piVar3 == 0xe);
      goto LAB_00177bb5;
    }
  }
  local_f1 = (allocator_type)0x0;
LAB_00177bb5:
  test((bool *)&local_f1);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 6) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  iVar6 = 0;
  bVar1 = true;
  while (bVar1) {
    for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
      for (sVar2 = 0; sVar2 != 2; sVar2 = sVar2 + 1) {
        piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&s,sVar2,iVar5,0);
        local_f1 = (allocator_type)(*piVar3 == (&DAT_001cb480)[sVar2 + (long)iVar6]);
        test((bool *)&local_f1);
      }
      iVar6 = iVar6 + 2;
    }
    bVar1 = false;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 1;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 6) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  bVar1 = true;
  iVar6 = 0;
  while (bVar1) {
    for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
      for (sVar2 = 0; sVar2 != 2; sVar2 = sVar2 + 1) {
        piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&s,sVar2,iVar5,0);
        local_f1 = (allocator_type)(*piVar3 == (&DAT_001cb4a0)[sVar2 + (long)iVar6]);
        test((bool *)&local_f1);
      }
      iVar6 = iVar6 + 2;
    }
    bVar1 = false;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&s);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 8) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  iVar6 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      for (sVar2 = 0; sVar2 != 2; sVar2 = sVar2 + 1) {
        piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&s,sVar2,iVar7,iVar5);
        local_f1 = (allocator_type)(*piVar3 == (&DAT_001cb650)[sVar2 + (long)iVar6]);
        test((bool *)&local_f1);
      }
      iVar6 = iVar6 + 2;
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  s.data_._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&s,&andres::defaultOrder,
             (allocator_type *)&base);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&base,3,(allocator_type *)&s);
  *base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View(&s,&local_f1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,&s);
  if (s.geometry_.size_ == 8) {
    sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension(&s);
    local_f1 = (allocator_type)(sVar2 == 3);
  }
  else {
    local_f1 = (allocator_type)0x0;
  }
  test((bool *)&local_f1);
  iVar6 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      for (sVar2 = 0; sVar2 != 2; sVar2 = sVar2 + 1) {
        piVar3 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&s,sVar2,iVar7,iVar5);
        local_f1 = (allocator_type)(*piVar3 == (&DAT_001cb670)[(long)iVar6 + sVar2]);
        test((bool *)&local_f1);
      }
      iVar6 = iVar6 + 2;
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&s.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&base.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::subViewsTest(){
    // 1D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 1 && s.dimension()==1
            );
            test(s(0)==4);
        }
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 1 && s.dimension()==1
            );
            test(s(0)==4);

        }
        // 1D sub-view
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 3;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 3 && s.dimension()==1
            );
            test(s(0)==4 && s(1)==5 && s(2)==6);
        }
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 3;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 3 && s.dimension()==1
            );
            test(s(0)==4 && s(1)==5 && s(2)==6);
        }
    }
    // 2D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] =2;
            base[1] =2;
            shape[0] = 1; 
            shape[1] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==2
            );
            test(s(0,0)==14);
        } 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] =2;
            base[1] =2;
            shape[0] = 1; 
            shape[1] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==2
            );
            test(s(0,0)==10);
        }     
        // 1D sub-view
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] =0;
            base[1] =0;
            shape[0] = 1; 
            shape[1] = 4;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 4 && s.dimension()==2
            );
            test(s(0,0)==0 && s(0,1)==6 && s(0,2)==12 && s(0,3)==18 );
        } 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] =0;
            base[1] =0;
            shape[0] = 1; 
            shape[1] = 4;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 4 && s.dimension()==2
            );
            test(s(0,0)==0 && s(0,1)==1 && s(0,2)==2 && s(0,3)==3);
        } 
        // 2D sub-view
        {
            int list[] = {8, 9, 10, 14, 15, 16};
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] = 2;
            base[1] = 1;
            shape[0] = 3;
            shape[1] = 2; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==2
            );
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(s(x, y) == list[index]);
                ++index;
            }
        } 
        {
            int list[] = {9, 13, 17, 10, 14, 18};
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] = 2;
            base[1] = 1;
            shape[0] = 3;
            shape[1] = 2; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==2
            );
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(s(x, y) == list[index]);
                ++index;
            }
        } 
    }
    // 3D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==3
            );
            test(s(0,0,0)==4);
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==3
            );
            test(s(0,0,0)==10);
        }
        // 1D sub-view
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 3 && s.dimension()==3
            );
            test(s(0,0,0)==4 && s(0,1,0)==7 && s(0,2,0)==10);
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 3 && s.dimension()==3
            );
            test(s(0,0,0)==10 && s(0,1,0)==12 && s(0,2,0)==14);
        }
        // 2D sub-view
        {
            int list[] = {4, 5, 7, 8, 10, 11};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 2;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 1; ++z)
            for(int y = 0; y < 3; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {10, 18, 12, 20, 14, 22};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 2;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 1; ++z)
            for(int y = 0; y < 3; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        }
        // 3D sub-view
        {
            int list[] = {4, 5, 7, 8, 16, 17, 19, 20};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0;
            shape[0] =2;
            shape[1] =2;
            shape[2] =2;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 8 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        } 
        {
            int list[] = {10, 18, 12, 20, 11, 19, 13, 21};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0;
            shape[0] =2;
            shape[1] =2;
            shape[2] =2;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 8 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        } 
    }
}